

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O2

void base64_stream_encode_avx2(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  undefined1 auVar1 [32];
  ulong uVar2;
  uint8_t *puVar3;
  byte bVar4;
  undefined1 (*pauVar5) [32];
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint8_t *o;
  uint8_t *s;
  base64_state *local_50;
  size_t *local_48;
  ulong local_40;
  size_t local_38;
  
  uVar7 = state->bytes;
  local_38 = 0;
  bVar4 = state->carry;
  puVar3 = (uint8_t *)out;
  pbVar6 = (byte *)src;
  local_50 = state;
  local_48 = outlen;
  if ((ulong)uVar7 == 2) goto LAB_00104acf;
  if (uVar7 == 1) goto LAB_00104a88;
  pauVar5 = (undefined1 (*) [32])src;
  local_40 = srclen;
  uVar2 = (ulong)uVar7;
  o = (uint8_t *)out;
  if (uVar7 == 0) {
    do {
      local_38 = uVar2;
      if (0x1f < local_40) {
        uVar2 = (local_40 - 4) / 0x18;
        local_40 = uVar2 * -0x18 + local_40;
        auVar9 = vpermq_avx2(*pauVar5,0x94);
        auVar10 = vpshufb_avx2(auVar9,_DAT_001083e0);
        auVar9 = vpand_avx2(auVar10,_DAT_00108400);
        auVar1 = vpmulhuw_avx2(auVar9,_DAT_00108420);
        local_38 = uVar2 * 0x20 + local_38;
        auVar9 = vpand_avx2(auVar10,_DAT_00108440);
        auVar10 = vpsllw_avx2(auVar9,8);
        auVar9 = vpsllw_avx2(auVar9,4);
        auVar9 = vpblendw_avx2(auVar9,auVar10,0xaa);
        auVar10[8] = 0x33;
        auVar10._0_8_ = 0x3333333333333333;
        auVar10[9] = 0x33;
        auVar10[10] = 0x33;
        auVar10[0xb] = 0x33;
        auVar10[0xc] = 0x33;
        auVar10[0xd] = 0x33;
        auVar10[0xe] = 0x33;
        auVar10[0xf] = 0x33;
        auVar10[0x10] = 0x33;
        auVar10[0x11] = 0x33;
        auVar10[0x12] = 0x33;
        auVar10[0x13] = 0x33;
        auVar10[0x14] = 0x33;
        auVar10[0x15] = 0x33;
        auVar10[0x16] = 0x33;
        auVar10[0x17] = 0x33;
        auVar10[0x18] = 0x33;
        auVar10[0x19] = 0x33;
        auVar10[0x1a] = 0x33;
        auVar10[0x1b] = 0x33;
        auVar10[0x1c] = 0x33;
        auVar10[0x1d] = 0x33;
        auVar10[0x1e] = 0x33;
        auVar10[0x1f] = 0x33;
        auVar1 = vpor_avx2(auVar9,auVar1);
        auVar10 = vpsubusb_avx2(auVar1,auVar10);
        auVar9[8] = 0x19;
        auVar9._0_8_ = 0x1919191919191919;
        auVar9[9] = 0x19;
        auVar9[10] = 0x19;
        auVar9[0xb] = 0x19;
        auVar9[0xc] = 0x19;
        auVar9[0xd] = 0x19;
        auVar9[0xe] = 0x19;
        auVar9[0xf] = 0x19;
        auVar9[0x10] = 0x19;
        auVar9[0x11] = 0x19;
        auVar9[0x12] = 0x19;
        auVar9[0x13] = 0x19;
        auVar9[0x14] = 0x19;
        auVar9[0x15] = 0x19;
        auVar9[0x16] = 0x19;
        auVar9[0x17] = 0x19;
        auVar9[0x18] = 0x19;
        auVar9[0x19] = 0x19;
        auVar9[0x1a] = 0x19;
        auVar9[0x1b] = 0x19;
        auVar9[0x1c] = 0x19;
        auVar9[0x1d] = 0x19;
        auVar9[0x1e] = 0x19;
        auVar9[0x1f] = 0x19;
        auVar9 = vpcmpgtb_avx2(auVar1,auVar9);
        auVar9 = vpsubb_avx2(auVar10,auVar9);
        auVar11._16_16_ = _DAT_00108320;
        auVar11._0_16_ = _DAT_00108320;
        auVar9 = vpshufb_avx2(auVar11,auVar9);
        auVar9 = vpaddb_avx2(auVar9,auVar1);
        *(undefined1 (*) [32])o = auVar9;
        s = *pauVar5 + 0x14;
        o = o + 0x20;
        for (uVar2 = uVar2 - 1; uVar2 != 0; uVar2 = uVar2 + lVar8) {
          if (uVar2 < 8) {
            lVar8 = -4;
            if (3 < uVar2) goto LAB_001049d5;
            lVar8 = -2;
            if (uVar2 == 1) {
              enc_loop_avx2_inner(&s,&o);
              break;
            }
          }
          else {
            enc_loop_avx2_inner(&s,&o);
            enc_loop_avx2_inner(&s,&o);
            enc_loop_avx2_inner(&s,&o);
            enc_loop_avx2_inner(&s,&o);
            lVar8 = -8;
LAB_001049d5:
            enc_loop_avx2_inner(&s,&o);
            enc_loop_avx2_inner(&s,&o);
          }
          enc_loop_avx2_inner(&s,&o);
          enc_loop_avx2_inner(&s,&o);
        }
        pauVar5 = (undefined1 (*) [32])(s + 4);
      }
      if (local_40 == 0) {
        uVar7 = 0;
        break;
      }
      srclen = local_40 - 1;
      out = (char *)(o + 1);
      *o = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)(*pauVar5)[0] >> 2];
      src = *pauVar5 + 1;
      bVar4 = ((*pauVar5)[0] & 3) << 4;
      local_38 = local_38 + 1;
LAB_00104a88:
      if (srclen == 0) {
        uVar7 = 1;
        break;
      }
      srclen = srclen - 1;
      puVar3 = (uint8_t *)out + 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar4 | (byte)*src >> 4)];
      pbVar6 = (byte *)src + 1;
      bVar4 = (*src & 0xfU) << 2;
      local_38 = local_38 + 1;
LAB_00104acf:
      if (srclen == 0) goto LAB_00104b28;
      local_40 = srclen - 1;
      *puVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(byte)(bVar4 | *pbVar6 >> 6)];
      pauVar5 = (undefined1 (*) [32])(pbVar6 + 1);
      o = puVar3 + 2;
      puVar3[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*pbVar6 & 0x3f]
      ;
      uVar2 = local_38 + 2;
    } while( true );
  }
LAB_00104b35:
  local_50->bytes = uVar7;
  local_50->carry = bVar4;
  *local_48 = local_38;
  return;
LAB_00104b28:
  uVar7 = 2;
  goto LAB_00104b35;
}

Assistant:

BASE64_ENC_FUNCTION(avx2)
{
#if HAVE_AVX2
	#include "../generic/enc_head.c"
	enc_loop_avx2(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}